

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  long lVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  sqlite3_io_methods *p;
  void *pvVar7;
  unixShmNode *pShmNode;
  sqlite3_mutex *psVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  size_t __n;
  unixShmNode *zBuf;
  ulong iOff;
  char *zFunc;
  char *pcVar13;
  int errcode;
  stat sStat;
  
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    p = (sqlite3_io_methods *)sqlite3_malloc(0x18);
    if (p == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    unixEnterMutex();
    psVar2 = fd[2].pMethods;
    pShmNode = (unixShmNode *)psVar2->xTruncate;
    if (pShmNode != (unixShmNode *)0x0) goto LAB_001239af;
    iVar9 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
    if ((iVar9 != 0) && (*(char *)((long)&psVar2->xRead + 5) == '\0')) {
      iVar9 = 0x70a;
      goto LAB_00123bb8;
    }
    sVar10 = strlen((char *)fd[7].pMethods);
    __n = (long)(int)sVar10 + 0x46;
    pShmNode = (unixShmNode *)sqlite3_malloc((int)__n);
    iVar9 = 7;
    if (pShmNode == (unixShmNode *)0x0) goto LAB_00123bb8;
    memset(pShmNode,0,__n);
    zBuf = pShmNode + 1;
    pShmNode->zFilename = (char *)zBuf;
    sqlite3_snprintf((int)sVar10 + 6,(char *)zBuf,"%s-shm",fd[7].pMethods);
    pShmNode->h = -1;
    psVar3 = fd[2].pMethods;
    psVar3->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)pShmNode;
    pShmNode->pInode = (unixInodeInfo *)psVar3;
    psVar8 = sqlite3_mutex_alloc(0);
    pShmNode->mutex = psVar8;
    if (psVar8 == (sqlite3_mutex *)0x0) goto LAB_00123bb8;
    if (*(char *)((long)&psVar2->xRead + 5) == '\0') {
      iVar5 = 0;
      iVar9 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
      if (iVar9 == 0) {
        iVar5 = 0x42;
      }
      else {
        pShmNode->isReadonly = '\x01';
      }
      uVar6 = robust_open((char *)zBuf,iVar5,sStat.st_mode & 0x1ff);
      pShmNode->h = uVar6;
      if ((int)uVar6 < 0) {
        sqlite3CantopenError(0x6ab0);
        pcVar13 = "open";
        iVar9 = 0xe;
        iVar5 = 0x6ab0;
      }
      else {
        (*aSyscall[0x14].pCurrent)((ulong)uVar6,(ulong)sStat.st_uid,(ulong)sStat.st_gid);
        iVar9 = unixShmSystemLock(pShmNode,1,0x80,1);
        if ((iVar9 != 0) || (iVar9 = robust_ftruncate(pShmNode->h,0), iVar9 == 0)) {
          iVar9 = unixShmSystemLock(pShmNode,0,0x80,1);
          if (iVar9 != 0) goto LAB_00123bb8;
          goto LAB_001239af;
        }
        pcVar13 = "ftruncate";
        iVar9 = 0x120a;
        iVar5 = 0x6ac0;
      }
      unixLogErrorAtLine(iVar9,pcVar13,(char *)zBuf,iVar5);
LAB_00123bb8:
      unixShmPurge((unixFile *)fd);
      sqlite3_free(p);
      unixLeaveMutex();
      return iVar9;
    }
LAB_001239af:
    *(unixShmNode **)p = pShmNode;
    pShmNode->nRef = pShmNode->nRef + 1;
    fd[8].pMethods = p;
    unixLeaveMutex();
    if (pShmNode->mutex == (sqlite3_mutex *)0x0) {
      psVar8 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(pShmNode->mutex);
      psVar8 = pShmNode->mutex;
    }
    p->xClose = (_func_int_sqlite3_file_ptr *)pShmNode->pFirst;
    pShmNode->pFirst = (unixShm *)p;
    if (psVar8 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar8);
    }
  }
  lVar1 = *(long *)fd[8].pMethods;
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  uVar4 = *(ushort *)(lVar1 + 0x20);
  iVar9 = 0;
  if (iRegion < (int)(uint)uVar4) goto LAB_00123bdb;
  *(int *)(lVar1 + 0x1c) = szRegion;
  if ((int)*(uint *)(lVar1 + 0x18) < 0) {
LAB_001239dd:
    pvVar7 = sqlite3_realloc(*(void **)(lVar1 + 0x28),(iRegion + 1) * 8);
    if (pvVar7 == (void *)0x0) {
      iVar9 = 0xc0a;
    }
    else {
      *(void **)(lVar1 + 0x28) = pvVar7;
      sVar10 = (size_t)szRegion;
      uVar4 = *(ushort *)(lVar1 + 0x20);
      iVar9 = 0;
      while ((int)(uint)uVar4 <= iRegion) {
        if ((int)*(uint *)(lVar1 + 0x18) < 0) {
          pvVar7 = sqlite3_malloc(szRegion);
          if (pvVar7 == (void *)0x0) {
            iVar9 = 7;
            break;
          }
          memset(pvVar7,0,sVar10);
        }
        else {
          pvVar7 = (void *)(*aSyscall[0x15].pCurrent)
                                     (0,sVar10,(ulong)((uint)(*(char *)(lVar1 + 0x22) == '\0') * 2 +
                                                      1),1,(ulong)*(uint *)(lVar1 + 0x18),
                                      uVar4 * sVar10);
          if (pvVar7 == (void *)0xffffffffffffffff) {
            pcVar13 = *(char **)(lVar1 + 0x10);
            zFunc = "mmap";
            iVar9 = 0x150a;
            errcode = 0x150a;
            iVar5 = 0x6b57;
            goto LAB_00123ba5;
          }
        }
        uVar4 = *(ushort *)(lVar1 + 0x20);
        *(void **)(*(long *)(lVar1 + 0x28) + (ulong)uVar4 * 8) = pvVar7;
        uVar4 = uVar4 + 1;
        *(ushort *)(lVar1 + 0x20) = uVar4;
      }
    }
  }
  else {
    iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),&sStat);
    iVar9 = 0x130a;
    if (iVar5 == 0) {
      iVar9 = (iRegion + 1) * szRegion;
      if (iVar9 <= sStat.st_size) goto LAB_001239dd;
      if (bExtend == 0) {
        iVar9 = 0;
      }
      else {
        lVar11 = (long)(int)(sStat.st_size / 0x1000);
        lVar12 = lVar11 + -1;
        iOff = lVar11 << 0xc | 0xfff;
        do {
          lVar12 = lVar12 + 1;
          if (iVar9 / 0x1000 <= lVar12) goto LAB_001239dd;
          iVar5 = seekAndWriteFd(*(int *)(lVar1 + 0x18),iOff,"",1,(int *)0x0);
          iOff = iOff + 0x1000;
        } while (iVar5 == 1);
        pcVar13 = *(char **)(lVar1 + 0x10);
        zFunc = "write";
        iVar9 = 0x130a;
        errcode = 0x130a;
        iVar5 = 0x6b3e;
LAB_00123ba5:
        unixLogErrorAtLine(errcode,zFunc,pcVar13,iVar5);
      }
    }
  }
  uVar4 = *(ushort *)(lVar1 + 0x20);
LAB_00123bdb:
  if (iRegion < (int)(uint)uVar4) {
    pvVar7 = *(void **)(*(long *)(lVar1 + 0x28) + (long)iRegion * 8);
  }
  else {
    pvVar7 = (void *)0x0;
  }
  *pp = pvVar7;
  iVar5 = 8;
  if (*(char *)(lVar1 + 0x22) == '\0') {
    iVar5 = iVar9;
  }
  if (iVar9 != 0) {
    iVar5 = iVar9;
  }
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  return iVar5;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  if( pShmNode->nRegion<=iRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = (iRegion+1)*szRegion;  /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, 0)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, (iRegion+1)*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while(pShmNode->nRegion<=iRegion){
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, szRegion,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }
      pShmNode->apRegion[pShmNode->nRegion] = pMem;
      pShmNode->nRegion++;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}